

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgroup_controller.cpp
# Opt level: O0

void __thiscall CgroupController::delay_enter(CgroupController *this)

{
  int iVar1;
  value_type *pvVar2;
  ContextManager *pCVar3;
  string local_90;
  path local_60;
  undefined1 local_38 [8];
  path path;
  CgroupController *this_local;
  
  if (this->enter_fd_ == -1) {
    path._M_cmpts._M_impl._M_t.
    super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
    ._M_t.
    super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
    .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
         (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
          )(unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
            )this;
    std::filesystem::__cxx11::path::path<char[6],std::filesystem::__cxx11::path>
              (&local_60,(char (*) [6])"tasks",auto_format);
    std::filesystem::__cxx11::operator/((path *)local_38,&this->path_,&local_60);
    std::filesystem::__cxx11::path::~path(&local_60);
    pvVar2 = std::filesystem::__cxx11::path::c_str((path *)local_38);
    iVar1 = open(pvVar2,0x80001);
    this->enter_fd_ = iVar1;
    if (this->enter_fd_ < 0) {
      pCVar3 = ContextManager::get();
      pvVar2 = std::filesystem::__cxx11::path::c_str((path *)local_38);
      format_abi_cxx11_(&local_90,"Cannot open file \'%s\' for writing: %m",pvVar2);
      (**pCVar3->_vptr_ContextManager)(pCVar3,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
    }
    std::filesystem::__cxx11::path::~path((path *)local_38);
  }
  return;
}

Assistant:

void CgroupController::delay_enter() {
    if (enter_fd_ != -1) {
        return;
    }
    fs::path path = path_ / "tasks";
    enter_fd_ = open(path.c_str(), O_WRONLY | O_CLOEXEC);
    if (enter_fd_ < 0) {
        die(format("Cannot open file '%s' for writing: %m", path.c_str()));
    }
}